

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O1

void Aig_RManSortNums(int *pArray,int nVars)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (1 < nVars) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      uVar1 = uVar5 + 1;
      uVar7 = uVar5 & 0xffffffff;
      uVar6 = uVar4;
      do {
        uVar3 = uVar6 & 0xffffffff;
        if (pArray[uVar6] <= pArray[(int)uVar7]) {
          uVar3 = uVar7;
        }
        uVar7 = uVar3;
        uVar6 = uVar6 + 1;
      } while ((uint)nVars != uVar6);
      iVar2 = pArray[uVar5];
      pArray[uVar5] = pArray[(int)uVar7];
      pArray[(int)uVar7] = iVar2;
      uVar4 = uVar4 + 1;
      uVar5 = uVar1;
    } while (uVar1 != nVars - 1);
  }
  return;
}

Assistant:

void Aig_RManSortNums( int * pArray, int nVars )
{
    int i, j, best_i, tmp;
    for ( i = 0; i < nVars-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nVars; j++ )
            if ( pArray[j] > pArray[best_i] )
                best_i = j;
        tmp = pArray[i]; pArray[i] = pArray[best_i]; pArray[best_i] = tmp;
    }
}